

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall clask::response_writer::set_header(response_writer *this,string *key,string *val)

{
  pointer ppVar1;
  __type _Var2;
  pointer __lhs;
  string h;
  string sStack_48;
  
  camelize(&sStack_48,key);
  __lhs = (this->headers).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__lhs == ppVar1) {
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::__cxx11::string&,std::__cxx11::string_const&>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&this->headers,&sStack_48,val);
LAB_0010956b:
      std::__cxx11::string::~string((string *)&sStack_48);
      return;
    }
    _Var2 = std::operator==(&__lhs->first,&sStack_48);
    if (_Var2) {
      std::__cxx11::string::_M_assign((string *)&__lhs->second);
      goto LAB_0010956b;
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

inline void response_writer::set_header(std::string key, const std::string& val) {
  auto h = camelize(key);
  for (auto& hh : headers) {
    if (hh.first == h) {
      hh.second = val;
      return;
    }
  }
  headers.emplace_back(h, val);
}